

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buf.cpp
# Opt level: O3

int __thiscall InputBuffer::read_from_fd(InputBuffer *this,int fd)

{
  int iVar1;
  undefined8 in_RAX;
  Mempool *pMVar2;
  Chunk *pCVar3;
  ssize_t sVar4;
  int *piVar5;
  undefined8 uVar6;
  EVP_PKEY_CTX *src;
  char *pcVar7;
  char *__format;
  int need_read;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  iVar1 = ioctl(fd,0x541b,(long)&uStack_28 + 4);
  if (iVar1 == -1) {
    if (pr_level < 0) {
      return -1;
    }
    __format = "[%-5s][%s:%d] ioctl FIONREAD error\n";
    pcVar7 = "error";
    uVar6 = 0x30;
LAB_00104cf0:
    printf(__format,pcVar7,"read_from_fd",uVar6);
  }
  else {
    pCVar3 = (this->super_BufferBase).data_buf;
    if (pCVar3 == (Chunk *)0x0) {
      pMVar2 = Mempool::get_instance();
      pCVar3 = Mempool::alloc_chunk(pMVar2,uStack_28._4_4_);
      (this->super_BufferBase).data_buf = pCVar3;
      if (pCVar3 == (Chunk *)0x0) {
        if (pr_level < 2) {
          return -1;
        }
        __format = "[%-5s][%s:%d] no free buf for alloc\n";
        pcVar7 = "info";
        uVar6 = 0x37;
        goto LAB_00104cf0;
      }
    }
    else {
      if (pCVar3->head != 0) {
        __assert_fail("data_buf->head == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                      ,0x3c,"int InputBuffer::read_from_fd(int)");
      }
      if (pCVar3->capacity - pCVar3->length < uStack_28._4_4_) {
        pMVar2 = Mempool::get_instance();
        pCVar3 = Mempool::alloc_chunk
                           (pMVar2,((this->super_BufferBase).data_buf)->length + uStack_28._4_4_);
        if (pCVar3 == (Chunk *)0x0) {
          if (pr_level < 2) {
            return -1;
          }
          __format = "[%-5s][%s:%d] no free buf for alloc\n";
          pcVar7 = "info";
          uVar6 = 0x40;
          goto LAB_00104cf0;
        }
        Chunk::copy(pCVar3,(EVP_PKEY_CTX *)(this->super_BufferBase).data_buf,src);
        pMVar2 = Mempool::get_instance();
        Mempool::retrieve(pMVar2,(this->super_BufferBase).data_buf);
        (this->super_BufferBase).data_buf = pCVar3;
      }
    }
    do {
      pCVar3 = (this->super_BufferBase).data_buf;
      iVar1 = uStack_28._4_4_;
      if (uStack_28._4_4_ == 0) {
        iVar1 = 0x1000;
      }
      sVar4 = read(fd,pCVar3->data + pCVar3->length,(long)iVar1);
      iVar1 = (int)sVar4;
      if (iVar1 != -1) {
        if (iVar1 < 1) {
          return iVar1;
        }
        if ((uStack_28._4_4_ != 0) && (uStack_28._4_4_ != iVar1)) {
          __assert_fail("already_read == need_read",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/data_buf.cpp"
                        ,0x53,"int InputBuffer::read_from_fd(int)");
        }
        piVar5 = &((this->super_BufferBase).data_buf)->length;
        *piVar5 = *piVar5 + iVar1;
        return iVar1;
      }
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
  }
  return -1;
}

Assistant:

int InputBuffer::read_from_fd(int fd)
{
    int need_read;
    // FIONREAD: get readable bytes num in kernel buffer
    if (ioctl(fd, FIONREAD, &need_read) == -1) {
        PR_ERROR("ioctl FIONREAD error\n");
        return -1;
    }
    
    if (data_buf == nullptr) {
        data_buf = Mempool::get_instance().alloc_chunk(need_read);
        if (data_buf == nullptr) {
            PR_INFO("no free buf for alloc\n");
            return -1;
        }
    }
    else {
        assert(data_buf->head == 0);
        if (data_buf->capacity - data_buf->length < (int)need_read) {   
            Chunk *new_buf = Mempool::get_instance().alloc_chunk(need_read + data_buf->length);
            if (new_buf == nullptr) {
                PR_INFO("no free buf for alloc\n");
                return -1;
            }
            new_buf->copy(data_buf);
            Mempool::get_instance().retrieve(data_buf);
            data_buf = new_buf;
        }
    }

    int already_read = 0;
    do { 
        if(need_read == 0) {
            already_read = read(fd, data_buf->data + data_buf->length, m4K);
        } else {
            already_read = read(fd, data_buf->data + data_buf->length, need_read);
        }
    } while (already_read == -1 && errno == EINTR);
    if (already_read > 0)  {
        if (need_read != 0) {
            assert(already_read == need_read);
        }
        data_buf->length += already_read;
    }

    return already_read;
}